

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O3

uint64_t llmsset_lookup2(llmsset_t dbs,uint64_t a,uint64_t b,int *created,int custom)

{
  ulong *puVar1;
  ushort uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint8_t *puVar5;
  uint uVar6;
  int iVar7;
  uint64_t uVar8;
  WorkerP *pWVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uint64_t uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  uint64_t local_60;
  int local_54;
  uint64_t local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_60 = b;
  local_50 = a;
  if (custom == 0) {
    uVar8 = 0xcbf29ce484222325;
    lVar11 = 0;
    uVar14 = a;
    do {
      uVar13 = uVar14 & 0xff;
      uVar14 = uVar14 >> 8;
      uVar8 = uVar8 ^ *(ulong *)((long)sylvan_tabhash_table + lVar11 + uVar13 * 8);
      lVar11 = lVar11 + 0x800;
    } while ((int)lVar11 != 0x4000);
    lVar11 = 0;
    uVar14 = b;
    do {
      uVar13 = uVar14 & 0xff;
      uVar14 = uVar14 >> 8;
      uVar8 = uVar8 ^ *(ulong *)(lVar11 + uVar13 * 8 + 0x1423e0);
      lVar11 = lVar11 + 0x800;
    } while ((int)lVar11 != 0x4000);
  }
  else {
    uVar8 = (*dbs->hash_cb)(a,b,0xcbf29ce484222325);
  }
  local_54 = 0;
  uVar13 = uVar8 & 0xffffff0000000000;
  local_38 = uVar8 >> 0x11 & 0xfffffffffffffff0 | 8;
  uVar15 = dbs->mask & uVar8;
  uVar16 = 0;
  uVar19 = uVar15;
  local_48 = uVar13;
  local_40 = uVar15;
  do {
    puVar3 = dbs->table;
    uVar10 = puVar3[uVar19];
    uVar17 = uVar16;
    if (uVar10 == 0) {
      if (uVar16 == 0) {
LAB_00129767:
        lVar11 = *(long *)(in_FS_OFFSET + -0x10);
        if (lVar11 == -1) {
          pWVar9 = lace_get_worker();
          uVar13 = dbs->table_size;
          uVar2 = pWVar9->worker;
          uVar6 = lace_workers();
          *(long *)(in_FS_OFFSET + -0x10) =
               *(long *)(in_FS_OFFSET + -0x10) + ((uVar13 >> 9) * (ulong)uVar2) / (ulong)uVar6;
        }
        else {
          lVar18 = 0;
          lVar12 = 0;
          do {
            uVar13 = dbs->bitmap2[lVar11 * 8 + lVar12];
            if (uVar13 != 0xffffffffffffffff) {
              uVar15 = LZCOUNT(~uVar13);
              LOCK();
              puVar1 = dbs->bitmap2 + lVar11 * 8 + lVar12;
              *puVar1 = *puVar1 | 0x8000000000000000U >> (uVar15 & 0x3f);
              UNLOCK();
              uVar13 = *(long *)(in_FS_OFFSET + -0x10) * 0x200;
              if (uVar15 + 1 + uVar13 == lVar18) {
                return 0;
              }
              if (custom != 0) {
                (*dbs->create_cb)(&local_50,&local_60);
              }
              puVar5 = dbs->data;
              uVar16 = (uVar15 | uVar13) - lVar18;
              *(uint64_t *)(puVar5 + uVar16 * 0x10) = local_50;
              *(uint64_t *)(puVar5 + uVar16 * 0x10 + 8) = local_60;
              uVar13 = local_48;
              uVar15 = local_40;
              goto LAB_00129876;
            }
            lVar12 = lVar12 + 1;
            lVar18 = lVar18 + -0x40;
          } while ((int)lVar12 != 8);
        }
        if (dbs->table_size < 0x200) {
          return 0;
        }
        uVar13 = dbs->table_size >> 9;
        do {
          uVar13 = uVar13 - 1;
          uVar15 = *(long *)(in_FS_OFFSET + -0x10) + 1;
          if (dbs->table_size >> 9 <= uVar15) {
            uVar15 = 0;
          }
          *(ulong *)(in_FS_OFFSET + -0x10) = uVar15;
          uVar16 = 0x8000000000000000 >> (uVar15 & 0x3f);
          puVar4 = dbs->bitmap1;
          while (uVar10 = puVar4[uVar15 >> 6], (uVar10 & uVar16) == 0) {
            puVar1 = puVar4 + (uVar15 >> 6);
            LOCK();
            bVar20 = uVar10 == *puVar1;
            if (bVar20) {
              *puVar1 = uVar10 | uVar16;
            }
            UNLOCK();
            if (bVar20) goto LAB_00129767;
          }
          if (uVar13 == 0) {
            return 0;
          }
        } while( true );
      }
LAB_00129876:
      puVar1 = puVar3 + uVar19;
      LOCK();
      uVar10 = *puVar1;
      bVar20 = uVar10 == 0;
      if (bVar20) {
        *puVar1 = uVar16 | uVar13;
        uVar10 = 0;
      }
      UNLOCK();
      uVar17 = uVar16;
      if (bVar20) {
        iVar7 = 1;
        if (custom != 0) {
          dbs->bitmapc[uVar16 >> 6] =
               dbs->bitmapc[uVar16 >> 6] | 0x8000000000000000U >> (uVar16 & 0x3f);
        }
        goto LAB_001299c2;
      }
    }
    if (uVar13 == (uVar10 & 0xffffff0000000000)) {
      uVar16 = uVar10 & 0xffffffffff;
      puVar5 = dbs->data;
      lVar11 = uVar16 * 0x10;
      if (custom == 0) {
        if ((*(uint64_t *)(puVar5 + lVar11) == local_50) &&
           (*(uint64_t *)(puVar5 + lVar11 + 8) == local_60)) {
          if (uVar17 != 0) {
            LOCK();
            dbs->bitmap2[uVar17 >> 6] =
                 dbs->bitmap2[uVar17 >> 6] & ~(0x8000000000000000U >> (uVar17 & 0x3f));
            UNLOCK();
          }
          goto LAB_001299bd;
        }
      }
      else {
        iVar7 = (*dbs->equals_cb)(local_50,local_60,*(uint64_t *)(puVar5 + lVar11),
                                  *(uint64_t *)(puVar5 + lVar11 + 8));
        uVar13 = local_48;
        uVar15 = local_40;
        if (iVar7 != 0) {
          if (uVar17 != 0) {
            (*dbs->destroy_cb)(local_50,local_60);
            LOCK();
            dbs->bitmap2[uVar17 >> 6] =
                 dbs->bitmap2[uVar17 >> 6] & ~(0x8000000000000000U >> (uVar17 & 0x3f));
            UNLOCK();
          }
LAB_001299bd:
          iVar7 = 0;
LAB_001299c2:
          *created = iVar7;
          return uVar16;
        }
      }
    }
    uVar19 = (ulong)((int)uVar19 + 1U & 7) | uVar19 & 0xfffffffffffffff8;
    uVar16 = uVar17;
    if (uVar19 == uVar15) {
      local_54 = local_54 + 1;
      if (local_54 == dbs->threshold) {
        return 0;
      }
      uVar8 = uVar8 + local_38;
      uVar15 = dbs->mask & uVar8;
      uVar19 = uVar15;
      local_40 = uVar15;
    }
  } while( true );
}

Assistant:

static inline uint64_t
llmsset_lookup2(const llmsset_t dbs, uint64_t a, uint64_t b, int* created, const int custom)
{
    uint64_t hash_rehash = 14695981039346656037LLU;
    if (custom) hash_rehash = dbs->hash_cb(a, b, hash_rehash);
    else hash_rehash = sylvan_tabhash16(a, b, hash_rehash);

    const uint64_t step = (((hash_rehash >> 20) | 1) << 3);
    const uint64_t hash = hash_rehash & MASK_HASH;
    uint64_t idx, last, cidx = 0;
    int i=0;

#if LLMSSET_MASK
    last = idx = hash_rehash & dbs->mask;
#else
    last = idx = hash_rehash % dbs->table_size;
#endif

    for (;;) {
        _Atomic(uint64_t)* bucket = dbs->table + idx;
        uint64_t v = atomic_load_explicit(bucket, memory_order_acquire);

        if (v == 0) {
            if (cidx == 0) {
                // Claim data bucket and write data
                cidx = claim_data_bucket(dbs);
                if (cidx == (uint64_t)-1) return 0; // failed to claim a data bucket
                if (custom) dbs->create_cb(&a, &b);
                uint64_t *d_ptr = ((uint64_t*)dbs->data) + 2*cidx;
                d_ptr[0] = a;
                d_ptr[1] = b;
            }
            if (atomic_compare_exchange_strong(bucket, &v, hash | cidx)) {
                if (custom) set_custom_bucket(dbs, cidx, custom);
                *created = 1;
                return cidx;
            }
        }

        if (hash == (v & MASK_HASH)) {
            uint64_t d_idx = v & MASK_INDEX;
            uint64_t *d_ptr = ((uint64_t*)dbs->data) + 2*d_idx;
            if (custom) {
                if (dbs->equals_cb(a, b, d_ptr[0], d_ptr[1])) {
                    if (cidx != 0) {
                        dbs->destroy_cb(a, b);
                        release_data_bucket(dbs, cidx);
                    }
                    *created = 0;
                    return d_idx;
                }
            } else {
                if (d_ptr[0] == a && d_ptr[1] == b) {
                    if (cidx != 0) release_data_bucket(dbs, cidx);
                    *created = 0;
                    return d_idx;
                }
            }
        }

        sylvan_stats_count(LLMSSET_LOOKUP);

        // find next idx on probe sequence
        idx = (idx & CL_MASK) | ((idx+1) & CL_MASK_R);
        if (idx == last) {
            if (++i == dbs->threshold) return 0; // failed to find empty spot in probe sequence

            // go to next cache line in probe sequence
            hash_rehash += step;

#if LLMSSET_MASK
            last = idx = hash_rehash & dbs->mask;
#else
            last = idx = hash_rehash % dbs->table_size;
#endif
        }
    }
}